

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleStringBuffer_setWriteLimit_Test::TEST_SimpleStringBuffer_setWriteLimit_Test
          (TEST_SimpleStringBuffer_setWriteLimit_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringBuffer).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupSimpleStringBuffer::TEST_GROUP_CppUTestGroupSimpleStringBuffer
            (&this->super_TEST_GROUP_CppUTestGroupSimpleStringBuffer);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringBuffer).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0035f040;
  return;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    SimpleString str("h", 10);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}